

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexMaterialArray.cpp
# Opt level: O1

void __thiscall
btTriangleIndexVertexMaterialArray::getLockedReadOnlyMaterialBase
          (btTriangleIndexVertexMaterialArray *this,uchar **materialBase,int *numMaterials,
          PHY_ScalarType *materialType,int *materialStride,uchar **triangleMaterialBase,
          int *numTriangles,int *triangleMaterialStride,PHY_ScalarType *triangleType,int subpart)

{
  btMaterialProperties *pbVar1;
  long lVar2;
  
  lVar2 = (long)subpart;
  pbVar1 = (this->m_materials).m_data;
  *numMaterials = pbVar1[lVar2].m_numMaterials;
  *materialBase = pbVar1[lVar2].m_materialBase;
  *materialType = PHY_FLOAT;
  *materialStride = pbVar1[lVar2].m_materialStride;
  *numTriangles = pbVar1[lVar2].m_numTriangles;
  *triangleMaterialBase = pbVar1[lVar2].m_triangleMaterialsBase;
  *triangleMaterialStride = pbVar1[lVar2].m_triangleMaterialStride;
  *triangleType = pbVar1[lVar2].m_triangleType;
  return;
}

Assistant:

void btTriangleIndexVertexMaterialArray::getLockedReadOnlyMaterialBase(const unsigned char **materialBase, int& numMaterials, PHY_ScalarType& materialType, int& materialStride,
                                           const unsigned char ** triangleMaterialBase, int& numTriangles, int& triangleMaterialStride, PHY_ScalarType& triangleType, int subpart)
{
    btMaterialProperties& mats = m_materials[subpart];

    numMaterials = mats.m_numMaterials;
    (*materialBase) = (const unsigned char *) mats.m_materialBase;
#ifdef BT_USE_DOUBLE_PRECISION
    materialType = PHY_DOUBLE;
#else
    materialType = PHY_FLOAT;
#endif
    materialStride = mats.m_materialStride;

    numTriangles = mats.m_numTriangles;
    (*triangleMaterialBase) = (const unsigned char *)mats.m_triangleMaterialsBase;
    triangleMaterialStride = mats.m_triangleMaterialStride;
    triangleType = mats.m_triangleType;
}